

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O1

void __thiscall
boost::ext::ut::v1_1_8::runner<ApprovalTests::cfg::reporter,16>::
on<void(*)(),boost::ext::ut::v1_1_8::none>
          (runner<ApprovalTests::cfg::reporter,16> *this,
          test<void_(*)(),_boost::ext::ut::v1_1_8::none> *test)

{
  ostream *poVar1;
  runner<ApprovalTests::cfg::reporter,16> *prVar2;
  long lVar3;
  string_view *psVar4;
  test_end test_end;
  test_begin test_begin;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  basic_string_view<char,_std::char_traits<char>_> *ftag;
  string_view *psVar12;
  ulong uVar13;
  char *pcVar14;
  pointer psVar15;
  string_view *psVar16;
  byte bVar17;
  string_view input;
  string_view input_00;
  string_view pattern;
  char local_a9;
  test<void_(*)(),_boost::ext::ut::v1_1_8::none> *local_a8;
  string_view *local_a0;
  runner<ApprovalTests::cfg::reporter,16> *local_98;
  pointer local_90;
  char *local_88;
  unsigned_long uStack_80;
  char *local_78;
  unsigned_long uStack_70;
  char *local_68;
  int iStack_60;
  undefined4 uStack_5c;
  char *local_58;
  unsigned_long uStack_50;
  char *local_48;
  unsigned_long uStack_40;
  
  pcVar14 = (test->name).data_;
  lVar3 = *(long *)(this + 600);
  *(unsigned_long *)(this + lVar3 * 0x10 + 0x270) = (test->name).size_;
  *(char **)(this + lVar3 * 0x10 + 0x278) = pcVar14;
  psVar15 = (test->tag).
            super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_90 = (test->tag).
             super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  bVar17 = psVar15 == local_90;
  bVar10 = (bool)bVar17;
  if (!(bool)bVar17) {
    local_a0 = (string_view *)CONCAT71(local_a0._1_7_,bVar17);
    local_98 = this + 0x70;
    local_a8 = test;
    do {
      input._M_str = psVar15->data_;
      input._M_len = psVar15->size_;
      pattern._M_str = "skip";
      pattern._M_len = 4;
      bVar9 = utility::is_match(input,pattern);
      prVar2 = local_98;
      if (bVar9) {
        std::ostream::write((char *)local_98,(long)(local_a8->name).data_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)prVar2,"...SKIPPED\n",0xb);
        *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      }
      else {
        psVar4 = *(string_view **)(this + 0x390);
        for (psVar12 = *(string_view **)(this + 0x388); psVar12 != psVar4; psVar12 = psVar12 + 1) {
          input_00._M_str = psVar15->data_;
          input_00._M_len = psVar15->size_;
          bVar10 = utility::is_match(input_00,*psVar12);
          if (bVar10) {
            bVar10 = true;
            bVar17 = bVar10;
            break;
          }
          bVar10 = (bool)bVar17;
        }
      }
      if (bVar9) break;
      psVar15 = psVar15 + 1;
      local_a0 = (string_view *)CONCAT71(local_a0._1_7_,psVar15 == local_90);
    } while (psVar15 != local_90);
    test = local_a8;
    bVar17 = (byte)local_a0;
  }
  if ((bVar17 & 1) != 0) {
    if (bVar10) {
      bVar10 = filter::operator()(this + 0x370,*(size_t *)(this + 600),
                                  (array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL>
                                   *)(this + 0x270));
      if (bVar10) {
        psVar16 = &test->name;
        lVar3 = *(long *)(this + 600);
        *(long *)(this + 600) = lVar3 + 1;
        if (lVar3 == 0) {
          local_88 = (test->type).data_;
          uStack_80 = (test->type).size_;
          local_78 = psVar16->data_;
          uStack_70 = (test->name).size_;
          uVar5 = (test->type).data_;
          uVar6 = (test->type).size_;
          test_begin.type.size_ = uVar6;
          test_begin.type.data_ = (char *)uVar5;
          uVar7 = (test->name).data_;
          uVar8 = (test->name).size_;
          test_begin.name.size_ = uVar8;
          test_begin.name.data_ = (char *)uVar7;
          local_68 = (test->location).file_;
          iStack_60 = (test->location).line_;
          test_begin.location._12_4_ = uStack_5c;
          test_begin.location.line_ = iStack_60;
          test_begin.location.file_ = local_68;
          ApprovalTests::cfg::reporter::on((reporter *)this,test_begin);
        }
        else {
          pcVar14 = (test->name).data_;
          poVar1 = (ostream *)(this + 0x70);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n \"",3);
          std::ostream::write((char *)poVar1,(long)pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"...",4);
        }
        if (this[0x3a0] == (runner<ApprovalTests::cfg::reporter,16>)0x1) {
          local_a8 = test;
          local_a0 = psVar16;
          if (*(long *)(this + 600) != 0) {
            uVar11 = 1;
            uVar13 = 0;
            do {
              pcVar14 = "";
              if (uVar11 != 1) {
                pcVar14 = ".";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,pcVar14,(ulong)(uVar11 != 1));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,*(char **)(this + uVar13 * 0x10 + 0x278),
                         *(long *)(this + 0x270 + uVar13 * 0x10));
              uVar13 = (ulong)uVar11;
              uVar11 = uVar11 + 1;
            } while (uVar13 < *(ulong *)(this + 600));
          }
          local_a9 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_a9,1);
          test = local_a8;
          psVar16 = local_a0;
        }
        (*test->run)();
        prVar2 = this + 600;
        *(long *)prVar2 = *(long *)prVar2 + -1;
        if (*(long *)prVar2 == 0) {
          local_58 = (test->type).data_;
          uStack_50 = (test->type).size_;
          local_48 = psVar16->data_;
          uStack_40 = psVar16->size_;
          test_end.name.data_ = local_48;
          test_end.type = test->type;
          test_end.name.size_ = uStack_40;
          ApprovalTests::cfg::reporter::on((reporter *)this,test_end);
        }
      }
    }
    else {
      std::ostream::write((char *)(this + 0x70),(long)(test->name).data_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(this + 0x70),"...SKIPPED\n",0xb);
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    }
  }
  return;
}

Assistant:

auto on(events::test<Ts...> test) {
      path_[level_] = test.name;

      auto execute = std::empty(test.tag);
      for (const auto& tag : test.tag) {
        if (utility::is_match(tag, "skip")) {
          on(events::skip<>{.type = test.type, .name = test.name});
          return;
        }

        for (const auto& ftag : tag_) {
          if (utility::is_match(tag, ftag)) {
            execute = true;
            break;
          }
        }
      }

      if (not execute) {
        on(events::skip<>{.type = test.type, .name = test.name});
        return;
      }

      if (filter_(level_, path_)) {
        if (not level_++) {
          reporter_.on(events::test_begin{
              .type = test.type, .name = test.name, .location = test.location});
        } else {
          reporter_.on(events::test_run{.type = test.type, .name = test.name});
        }

        if (dry_run_) {
          for (auto i = 0u; i < level_; ++i) {
            std::cout << (i ? "." : "") << path_[i];
          }
          std::cout << '\n';
        }

#if defined(__cpp_exceptions)
        try {
#endif
          test();
#if defined(__cpp_exceptions)
        } catch (const events::fatal_assertion&) {
        } catch (const std::exception& exception) {
          ++fails_;
          reporter_.on(events::exception{exception.what()});
        } catch (...) {
          ++fails_;
          reporter_.on(events::exception{"Unknown exception"});
        }
#endif

        if (not--level_) {
          reporter_.on(events::test_end{.type = test.type, .name = test.name});
        }
      }
    }